

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O1

int mbedtls_x509_crt_parse_der(mbedtls_x509_crt *chain,uchar *buf,size_t buflen)

{
  uint uVar1;
  size_t __n;
  ulong uVar2;
  int iVar3;
  mbedtls_x509_crt *pmVar4;
  uchar *puVar5;
  mbedtls_x509_crt *pmVar6;
  uchar *__size;
  mbedtls_x509_crt *crt;
  uchar *end;
  mbedtls_x509_crt *pmVar7;
  int iVar8;
  uchar *p;
  size_t len;
  mbedtls_x509_buf sig_params1;
  size_t len_1;
  mbedtls_x509_buf sig_params2;
  uchar *local_b0;
  mbedtls_x509_crt *local_a8;
  ulong local_a0;
  int *local_98;
  uchar *local_90;
  mbedtls_x509_buf local_88;
  size_t local_70;
  mbedtls_x509_buf local_68;
  mbedtls_x509_buf local_48;
  
  if (buf == (uchar *)0x0 || chain == (mbedtls_x509_crt *)0x0) {
    return -0x2800;
  }
  pmVar4 = chain;
  pmVar6 = (mbedtls_x509_crt *)0x0;
  do {
    pmVar7 = pmVar6;
    pmVar6 = pmVar4;
    crt = pmVar6;
    if (pmVar6->version == 0) goto LAB_00121b6f;
    pmVar4 = pmVar6->next;
  } while (pmVar6->next != (mbedtls_x509_crt *)0x0);
  if ((pmVar6->version != 0) && (pmVar6->next == (mbedtls_x509_crt *)0x0)) {
    pmVar4 = (mbedtls_x509_crt *)calloc(1,0x228);
    pmVar6->next = pmVar4;
    if (pmVar4 == (mbedtls_x509_crt *)0x0) {
      return -0x2880;
    }
    memset(pmVar4,0,0x228);
    crt = pmVar6->next;
    pmVar7 = pmVar6;
  }
LAB_00121b6f:
  local_88.tag = 0;
  local_88._4_4_ = 0;
  local_88.len = 0;
  local_88.p = (uchar *)0x0;
  local_48.tag = 0;
  local_48._4_4_ = 0;
  local_48.len = 0;
  local_48.p = (uchar *)0x0;
  local_68.tag = 0;
  local_68._4_4_ = 0;
  local_68.len = 0;
  local_68.p = (uchar *)0x0;
  iVar3 = -0x2800;
  if ((buf == (uchar *)0x0) || (crt == (mbedtls_x509_crt *)0x0)) goto LAB_00121cf2;
  local_b0 = buf;
  local_a0 = buflen;
  iVar3 = mbedtls_asn1_get_tag(&local_b0,buf + buflen,&local_a0,0x30);
  uVar2 = local_a0;
  if (iVar3 != 0) {
    mbedtls_x509_crt_free(crt);
    iVar3 = -0x2180;
    goto LAB_00121cf2;
  }
  local_a8 = chain;
  if ((ulong)((long)(buf + buflen) - (long)local_b0) < local_a0) {
    mbedtls_x509_crt_free(crt);
LAB_00121c16:
    iVar3 = -0x21e6;
    chain = local_a8;
  }
  else {
    __size = local_b0 + (local_a0 - (long)buf);
    (crt->raw).len = (size_t)__size;
    puVar5 = (uchar *)calloc(1,(size_t)__size);
    (crt->raw).p = puVar5;
    if (puVar5 == (uchar *)0x0) {
      iVar3 = -0x2880;
      local_b0 = (uchar *)0x0;
      chain = local_a8;
      goto LAB_00121cf2;
    }
    local_b0 = puVar5;
    memcpy(puVar5,buf,(size_t)__size);
    local_b0 = puVar5 + ((long)__size - uVar2);
    (crt->tbs).p = local_b0;
    iVar3 = mbedtls_asn1_get_tag(&local_b0,puVar5 + (long)__size,&local_a0,0x30);
    if (iVar3 != 0) {
      mbedtls_x509_crt_free(crt);
      iVar3 = iVar3 + -0x2180;
      chain = local_a8;
      goto LAB_00121cf2;
    }
    end = local_b0 + local_a0;
    (crt->tbs).len = (long)end - (long)(crt->tbs).p;
    local_98 = &crt->version;
    local_90 = puVar5 + (long)__size;
    iVar3 = mbedtls_asn1_get_tag(&local_b0,end,&local_70,0xa0);
    chain = local_a8;
    if (iVar3 == 0) {
      puVar5 = local_b0 + local_70;
      iVar3 = mbedtls_asn1_get_int(&local_b0,puVar5,local_98);
      if (iVar3 == 0) {
        iVar3 = -0x2266;
        if (local_b0 == puVar5) {
          iVar3 = 0;
        }
      }
      else {
        iVar3 = iVar3 + -0x2200;
      }
    }
    else if (iVar3 == -0x62) {
      *local_98 = 0;
      iVar3 = 0;
    }
    if ((iVar3 == 0) && (iVar3 = mbedtls_x509_get_serial(&local_b0,end,&crt->serial), iVar3 == 0)) {
      iVar3 = mbedtls_x509_get_alg(&local_b0,end,&crt->sig_oid,&local_88);
      if (iVar3 == 0) {
        uVar1 = *local_98;
        *local_98 = uVar1 + 1;
        if (2 < (int)uVar1) {
          mbedtls_x509_crt_free(crt);
          iVar3 = -0x2580;
          goto LAB_00121cf2;
        }
        iVar3 = mbedtls_x509_get_sig_alg
                          (&crt->sig_oid,&local_88,&crt->sig_md,&crt->sig_pk,&crt->sig_opts);
        if (iVar3 != 0) {
          mbedtls_x509_crt_free(crt);
          goto LAB_00121cf2;
        }
        (crt->issuer_raw).p = local_b0;
        iVar3 = mbedtls_asn1_get_tag(&local_b0,end,&local_a0,0x30);
        if (iVar3 != 0) {
          mbedtls_x509_crt_free(crt);
          iVar3 = iVar3 + -0x2180;
          goto LAB_00121cf2;
        }
        iVar3 = mbedtls_x509_get_name(&local_b0,local_b0 + local_a0,&crt->issuer);
        if (iVar3 == 0) {
          (crt->issuer_raw).len = (long)local_b0 - (long)(crt->issuer_raw).p;
          iVar3 = x509_get_dates(&local_b0,end,&crt->valid_from,&crt->valid_to);
          if (iVar3 == 0) {
            (crt->subject_raw).p = local_b0;
            iVar3 = mbedtls_asn1_get_tag(&local_b0,end,&local_a0,0x30);
            if (iVar3 != 0) {
              mbedtls_x509_crt_free(crt);
              iVar3 = iVar3 + -0x2180;
              chain = local_a8;
              goto LAB_00121cf2;
            }
            if ((local_a0 == 0) ||
               (iVar3 = mbedtls_x509_get_name(&local_b0,local_b0 + local_a0,&crt->subject),
               iVar3 == 0)) {
              (crt->subject_raw).len = (long)local_b0 - (long)(crt->subject_raw).p;
              iVar3 = mbedtls_pk_parse_subpubkey(&local_b0,end,&crt->pk);
              if ((((iVar3 == 0) &&
                   (((*local_98 & 0xfffffffeU) != 2 ||
                    (iVar3 = x509_get_uid(&local_b0,end,&crt->issuer_id,1), iVar3 == 0)))) &&
                  (((*local_98 & 0xfffffffeU) != 2 ||
                   (iVar3 = x509_get_uid(&local_b0,end,&crt->subject_id,2), iVar3 == 0)))) &&
                 ((*local_98 != 3 || (iVar3 = x509_get_crt_ext(&local_b0,end,crt), iVar3 == 0)))) {
                if (local_b0 != end) {
LAB_00122044:
                  mbedtls_x509_crt_free(crt);
                  goto LAB_00121c16;
                }
                iVar3 = mbedtls_x509_get_alg(&local_b0,local_90,&local_68,&local_48);
                if (iVar3 == 0) {
                  __n = (crt->sig_oid).len;
                  if ((((__n != local_68.len) ||
                       (iVar3 = bcmp((crt->sig_oid).p,local_68.p,__n), iVar3 != 0)) ||
                      (local_88.len != local_48.len)) ||
                     ((local_88.len != 0 &&
                      (iVar3 = bcmp(local_88.p,local_48.p,local_88.len), iVar3 != 0)))) {
                    mbedtls_x509_crt_free(crt);
                    iVar3 = -0x2680;
                    chain = local_a8;
                    goto LAB_00121cf2;
                  }
                  iVar3 = mbedtls_x509_get_sig(&local_b0,local_90,&crt->sig);
                  if (iVar3 == 0) {
                    if (local_b0 == local_90) {
                      iVar3 = 0;
                      chain = local_a8;
                      goto LAB_00121cf2;
                    }
                    goto LAB_00122044;
                  }
                }
              }
            }
          }
        }
        mbedtls_x509_crt_free(crt);
        chain = local_a8;
        goto LAB_00121cf2;
      }
    }
    mbedtls_x509_crt_free(crt);
  }
LAB_00121cf2:
  iVar8 = 0;
  if (iVar3 != 0) {
    if (pmVar7 != (mbedtls_x509_crt *)0x0) {
      pmVar7->next = (mbedtls_x509_crt *)0x0;
    }
    iVar8 = iVar3;
    if (crt != chain) {
      free(crt);
    }
  }
  return iVar8;
}

Assistant:

int mbedtls_x509_crt_parse_der( mbedtls_x509_crt *chain, const unsigned char *buf,
                        size_t buflen )
{
    int ret;
    mbedtls_x509_crt *crt = chain, *prev = NULL;

    /*
     * Check for valid input
     */
    if( crt == NULL || buf == NULL )
        return( MBEDTLS_ERR_X509_BAD_INPUT_DATA );

    while( crt->version != 0 && crt->next != NULL )
    {
        prev = crt;
        crt = crt->next;
    }

    /*
     * Add new certificate on the end of the chain if needed.
     */
    if( crt->version != 0 && crt->next == NULL )
    {
        crt->next = mbedtls_calloc( 1, sizeof( mbedtls_x509_crt ) );

        if( crt->next == NULL )
            return( MBEDTLS_ERR_X509_ALLOC_FAILED );

        prev = crt;
        mbedtls_x509_crt_init( crt->next );
        crt = crt->next;
    }

    if( ( ret = x509_crt_parse_der_core( crt, buf, buflen ) ) != 0 )
    {
        if( prev )
            prev->next = NULL;

        if( crt != chain )
            mbedtls_free( crt );

        return( ret );
    }

    return( 0 );
}